

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear.cpp
# Opt level: O3

bool __thiscall LinearGE<0,_0>::propagate(LinearGE<0,_0> *this)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  Clause *pCVar5;
  IntView<0> *pIVar6;
  ulong uVar7;
  Lit *pLVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  IntView<1> *pIVar12;
  size_t sVar13;
  IntVar *pIVar14;
  long lVar15;
  ulong uVar16;
  int64_t iVar17;
  Clause *local_48;
  vec<Lit> *local_40;
  long local_38;
  
  iVar17 = this->fix_sum;
  uVar4 = (this->x).sz;
  uVar16 = (ulong)uVar4;
  uVar1 = this->fix_x;
  uVar11 = (ulong)uVar1;
  if (uVar1 < uVar4) {
    pIVar6 = (this->x).data + uVar11;
    lVar10 = uVar16 - uVar11;
    do {
      iVar17 = iVar17 + (pIVar6->var->max).v;
      pIVar6 = pIVar6 + 1;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  uVar2 = (this->y).sz;
  uVar7 = (ulong)uVar2;
  uVar9 = this->fix_y;
  if (uVar9 < uVar2) {
    lVar10 = uVar7 - uVar9;
    pIVar12 = (this->y).data + uVar9;
    do {
      iVar17 = iVar17 - (pIVar12->var->min).v;
      pIVar12 = pIVar12 + 1;
      lVar10 = lVar10 + -1;
    } while (lVar10 != 0);
  }
  if (uVar1 < uVar4) {
    local_40 = &this->ps;
    do {
      pIVar14 = (this->x).data[uVar11].var;
      lVar10 = (pIVar14->max).v - iVar17;
      if ((pIVar14->min).v < lVar10) {
        if (so.lazy == true) {
          local_38 = lVar10;
          if ((int)uVar16 != 0) {
            lVar10 = 0;
            uVar16 = 0;
            do {
              iVar3 = (**(code **)(**(long **)((long)&((this->x).data)->var + lVar10) + 0x48))();
              (this->ps).data[uVar16].x = iVar3;
              uVar16 = uVar16 + 1;
              lVar10 = lVar10 + 0x10;
            } while (uVar16 < (this->x).sz);
          }
          if ((this->y).sz == 0) {
            pLVar8 = (this->ps).data;
          }
          else {
            lVar10 = 0;
            uVar16 = 0;
            do {
              iVar3 = (**(code **)(**(long **)((long)&((this->y).data)->var + lVar10) + 0x40))();
              pLVar8 = (this->ps).data;
              pLVar8[(this->x).sz + (int)uVar16].x = iVar3;
              uVar16 = uVar16 + 1;
              lVar10 = lVar10 + 0x10;
            } while (uVar16 < (this->y).sz);
          }
          pLVar8[uVar11].x = pLVar8->x;
          uVar4 = (this->ps).sz;
          sVar13 = (ulong)(uVar4 - 1) * 4 + 8;
          if (uVar4 == 0) {
            sVar13 = 8;
          }
          pCVar5 = (Clause *)malloc(sVar13);
          Clause::Clause<vec<Lit>>(pCVar5,local_40,false);
          *(byte *)pCVar5 = *(byte *)pCVar5 | 2;
          local_48 = pCVar5;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_48);
          pIVar14 = (this->x).data[uVar11].var;
          pCVar5 = local_48;
          lVar10 = local_38;
        }
        else {
          pCVar5 = (Clause *)0x0;
        }
        iVar3 = (*(pIVar14->super_Var).super_Branching._vptr_Branching[0xe])
                          (pIVar14,lVar10,pCVar5,1);
        if ((char)iVar3 == '\0') {
          return false;
        }
        uVar16 = (ulong)(this->x).sz;
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar16);
    uVar7 = (ulong)(this->y).sz;
    uVar9 = this->fix_y;
  }
  if (uVar9 < (uint)uVar7) {
    local_40 = &this->ps;
    uVar16 = (ulong)uVar9;
    do {
      pIVar14 = (this->y).data[uVar16].var;
      lVar15 = (pIVar14->min).v + iVar17;
      lVar10 = (long)(pIVar14->max).v;
      if (lVar10 != lVar15 && SBORROW8(-lVar15,-lVar10) == -lVar15 + lVar10 < 0) {
        if (so.lazy == true) {
          local_38 = uVar16 * 0x10;
          if ((this->x).sz == 0) {
            uVar4 = 0;
          }
          else {
            lVar10 = 0;
            uVar11 = 0;
            do {
              iVar3 = (**(code **)(**(long **)((long)&((this->x).data)->var + lVar10) + 0x48))();
              (this->ps).data[uVar11].x = iVar3;
              uVar11 = uVar11 + 1;
              uVar4 = (this->x).sz;
              lVar10 = lVar10 + 0x10;
            } while (uVar11 < uVar4);
            uVar7 = (ulong)(this->y).sz;
          }
          if ((int)uVar7 == 0) {
            pLVar8 = (this->ps).data;
          }
          else {
            lVar10 = 0;
            uVar11 = 0;
            do {
              iVar3 = (**(code **)(**(long **)((long)&((this->y).data)->var + lVar10) + 0x40))();
              pLVar8 = (this->ps).data;
              pLVar8[(this->x).sz + (int)uVar11].x = iVar3;
              uVar11 = uVar11 + 1;
              lVar10 = lVar10 + 0x10;
            } while (uVar11 < (this->y).sz);
            uVar4 = (this->x).sz;
          }
          pLVar8[uVar4 + (int)uVar16].x = pLVar8->x;
          uVar4 = (this->ps).sz;
          sVar13 = (ulong)(uVar4 - 1) * 4 + 8;
          if (uVar4 == 0) {
            sVar13 = 8;
          }
          pCVar5 = (Clause *)malloc(sVar13);
          Clause::Clause<vec<Lit>>(pCVar5,local_40,false);
          *(byte *)pCVar5 = *(byte *)pCVar5 | 2;
          local_48 = pCVar5;
          vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_48);
          pIVar14 = *(IntVar **)((long)&((this->y).data)->var + local_38);
          pCVar5 = local_48;
        }
        else {
          pCVar5 = (Clause *)0x0;
        }
        iVar3 = (*(pIVar14->super_Var).super_Branching._vptr_Branching[0xf])
                          (pIVar14,lVar15,pCVar5,1);
        if ((char)iVar3 == '\0') {
          return false;
        }
        uVar7 = (ulong)(this->y).sz;
      }
      uVar16 = uVar16 + 1;
    } while (uVar16 < uVar7);
  }
  return true;
}

Assistant:

bool propagate() override {
		if ((R != 0) && r.isFalse()) {
			return true;
		}

		int64_t max_sum = fix_sum;

		for (unsigned int i = fix_x; i < x.size(); i++) {
			max_sum += x[i].getMax();
		}
		for (unsigned int i = fix_y; i < y.size(); i++) {
			max_sum += y[i].getMax();
		}

		//		if (R && max_sum < 0) setDom2(r, setVal, 0, x.size()+y.size());

		if ((R != 0) && max_sum < 0) {
			const int64_t v = 0;
			if (r.setValNotR(v != 0)) {
				Reason expl;
				if (so.lazy) {
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + 1] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + 1 + x.size()] = y[j].getMaxLit();
					}
					expl = Reason_new(ps);
				}
				if (!r.setVal(v != 0, expl)) {
					return false;
				}
			}
		}

		if ((R != 0) && !r.isTrue()) {
			return true;
		}

		//		for (int i = fix_x; i < x.size(); i++) {
		//			setDom2(x[i], setMin, x[i].getMax()-max_sum, i);
		//		}

		//		for (int i = fix_y; i < y.size(); i++) {
		//			setDom2(y[i], setMin, y[i].getMax()-max_sum, x.size()+i);
		//		}

		for (unsigned int i = fix_x; i < x.size(); i++) {
			const int64_t v = x[i].getMax() - max_sum;
			if (x[i].setMinNotR(v)) {
				Reason expl;
				if (so.lazy) {
					if ((R != 0) && r.isFixed()) {
						ps[0] = r.getValLit();
					}
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + R] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + R + x.size()] = y[j].getMaxLit();
					}
					ps[R + i] = ps[0];
					expl = Reason_new(ps);
				}
				if (!x[i].setMin(v, expl)) {
					return false;
				}
			}
		}

		for (unsigned int i = fix_y; i < y.size(); i++) {
			const int64_t v = y[i].getMax() - max_sum;
			if (y[i].setMinNotR(v)) {
				Reason expl;
				if (so.lazy) {
					if ((R != 0) && r.isFixed()) {
						ps[0] = r.getValLit();
					}
					for (unsigned int j = 0; j < x.size(); j++) {
						ps[j + R] = x[j].getMaxLit();
					}
					for (unsigned int j = 0; j < y.size(); j++) {
						ps[j + R + x.size()] = y[j].getMaxLit();
					}
					ps[R + x.size() + i] = ps[0];
					expl = Reason_new(ps);
				}
				if (!y[i].setMin(v, expl)) {
					return false;
				}
			}
		}

		return true;
	}